

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseCharDataInternal(xmlParserCtxtPtr ctxt,int partial)

{
  byte *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  uchar uVar7;
  xmlChar *pxVar8;
  xmlParserInputPtr pxVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *pbVar14;
  
  pxVar9 = ctxt->input;
  uVar2 = pxVar9->line;
  uVar4 = pxVar9->col;
  if (((pxVar9->flags & 0x40) == 0) && ((long)pxVar9->end - (long)pxVar9->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar9 = ctxt->input;
  }
  pbVar13 = pxVar9->cur;
  do {
    while( true ) {
      while( true ) {
        bVar6 = *pbVar13;
        uVar12 = (ulong)bVar6;
        if (bVar6 != 10) break;
        iVar10 = pxVar9->line;
        pbVar14 = pbVar13;
        do {
          iVar10 = iVar10 + 1;
          pxVar9->line = iVar10;
          pxVar9->col = 1;
          pbVar13 = pbVar14 + 1;
          pbVar1 = pbVar14 + 1;
          pbVar14 = pbVar13;
        } while (*pbVar1 == 10);
      }
      if (bVar6 != 0x20) break;
      pbVar13 = pbVar13 + 1;
      pxVar9->col = pxVar9->col + 1;
    }
    if (bVar6 == 0x3c) {
      pxVar8 = pxVar9->cur;
      iVar10 = (int)pbVar13 - (int)pxVar8;
      if (iVar10 < 1) {
        return;
      }
      pxVar9->cur = pbVar13;
      xmlCharacters(ctxt,pxVar8,iVar10,1);
      return;
    }
    iVar10 = pxVar9->col;
    while( true ) {
      while( true ) {
        uVar7 = ""[uVar12];
        pbVar14 = pbVar13;
        while (uVar7 != '\0') {
          iVar10 = iVar10 + 1;
          pbVar13 = pbVar14 + 1;
          pbVar14 = pbVar14 + 1;
          uVar7 = ""[*pbVar13];
        }
        pxVar9->col = iVar10;
        if (*pbVar14 != 10) break;
        iVar10 = pxVar9->line;
        pbVar13 = pbVar14;
        do {
          iVar10 = iVar10 + 1;
          pxVar9->line = iVar10;
          pxVar9->col = 1;
          pbVar14 = pbVar13 + 1;
          uVar12 = (ulong)*pbVar14;
          pbVar13 = pbVar13 + 1;
        } while (*pbVar14 == 10);
        iVar10 = 1;
      }
      if (*pbVar14 != 0x5d) break;
      pbVar13 = pbVar14 + 1;
      if ((pbVar14[1] == 0x5d) && (pbVar14[2] == 0x3e)) {
        xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
        ctxt->input->cur = pbVar13;
        return;
      }
      if ((partial != 0) && ((long)pxVar9->end - (long)pbVar14 < 2)) break;
      iVar10 = iVar10 + 1;
      pxVar9->col = iVar10;
      uVar12 = (ulong)*pbVar13;
    }
    pxVar8 = pxVar9->cur;
    iVar10 = (int)pbVar14 - (int)pxVar8;
    if (0 < iVar10) {
      pxVar9->cur = pbVar14;
      xmlCharacters(ctxt,pxVar8,iVar10,0);
      pxVar9 = ctxt->input;
      uVar3 = pxVar9->line;
      uVar5 = pxVar9->col;
      uVar2 = uVar3;
      uVar4 = uVar5;
    }
    pxVar9->cur = pbVar14;
    bVar6 = *pbVar14;
    if (bVar6 == 0xd) {
      if (pbVar14[1] != 10) goto LAB_00133251;
      pxVar9->cur = pbVar14 + 1;
      pxVar9->line = pxVar9->line + 1;
      pbVar13 = pbVar14 + 2;
      pxVar9->col = 1;
    }
    else {
      if (bVar6 == 0x26) {
        return;
      }
      if (bVar6 == 0x3c) {
        return;
      }
      if (((partial != 0) && (bVar6 == 0x5d)) && ((long)pxVar9->end - (long)pbVar14 < 2)) {
        return;
      }
LAB_00133251:
      uVar11 = pxVar9->flags;
      if ((uVar11 & 0x40) == 0) {
        xmlParserShrink(ctxt);
        pxVar9 = ctxt->input;
        uVar11 = pxVar9->flags;
      }
      if (((uVar11 & 0x40) == 0) && ((long)pxVar9->end - (long)pxVar9->cur < 0xfa)) {
        xmlParserGrow(ctxt);
        pxVar9 = ctxt->input;
      }
      pbVar13 = pxVar9->cur;
    }
    if (1 < (byte)(*pbVar13 - 9) && (char)*pbVar13 < ' ') {
      pxVar9->line = uVar2;
      pxVar9->col = uVar4;
      xmlParseCharDataComplex(ctxt,partial);
      return;
    }
  } while( true );
}

Assistant:

static void
xmlParseCharDataInternal(xmlParserCtxtPtr ctxt, int partial) {
    const xmlChar *in;
    int nbchar = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;
    int ccol;

    GROW;
    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
get_more_space:
        while (*in == 0x20) { in++; ctxt->input->col++; }
        if (*in == 0xA) {
            do {
                ctxt->input->line++; ctxt->input->col = 1;
                in++;
            } while (*in == 0xA);
            goto get_more_space;
        }
        if (*in == '<') {
            nbchar = in - ctxt->input->cur;
            if (nbchar > 0) {
                const xmlChar *tmp = ctxt->input->cur;
                ctxt->input->cur = in;

                xmlCharacters(ctxt, tmp, nbchar, 1);
            }
            return;
        }

get_more:
        ccol = ctxt->input->col;
        while (test_char_data[*in]) {
            in++;
            ccol++;
        }
        ctxt->input->col = ccol;
        if (*in == 0xA) {
            do {
                ctxt->input->line++; ctxt->input->col = 1;
                in++;
            } while (*in == 0xA);
            goto get_more;
        }
        if (*in == ']') {
            if ((in[1] == ']') && (in[2] == '>')) {
                xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
                ctxt->input->cur = in + 1;
                return;
            }
            if ((!partial) || (ctxt->input->end - in >= 2)) {
                in++;
                ctxt->input->col++;
                goto get_more;
            }
        }
        nbchar = in - ctxt->input->cur;
        if (nbchar > 0) {
            const xmlChar *tmp = ctxt->input->cur;
            ctxt->input->cur = in;

            xmlCharacters(ctxt, tmp, nbchar, 0);

            line = ctxt->input->line;
            col = ctxt->input->col;
        }
        ctxt->input->cur = in;
        if (*in == 0xD) {
            in++;
            if (*in == 0xA) {
                ctxt->input->cur = in;
                in++;
                ctxt->input->line++; ctxt->input->col = 1;
                continue; /* while */
            }
            in--;
        }
        if (*in == '<') {
            return;
        }
        if (*in == '&') {
            return;
        }
        if ((partial) && (*in == ']') && (ctxt->input->end - in < 2)) {
            return;
        }
        SHRINK;
        GROW;
        in = ctxt->input->cur;
    } while (((*in >= 0x20) && (*in <= 0x7F)) ||
             (*in == 0x09) || (*in == 0x0a));
    ctxt->input->line = line;
    ctxt->input->col = col;
    xmlParseCharDataComplex(ctxt, partial);
}